

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O2

uint32_t cppcms::impl::string_map::entry::calc_hash(char *key)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  
  uVar3 = 0;
  while( true ) {
    bVar1 = *key;
    if (bVar1 == 0) break;
    key = (char *)((byte *)key + 1);
    uVar2 = uVar3 * 0x10 + (uint)bVar1;
    uVar3 = uVar2 & 0xfffffff ^ uVar2 >> 0x18 & 0xfffffff0;
  }
  return uVar3;
}

Assistant:

static uint32_t calc_hash(char const *key)
				{
					uint32_t state = cppcms::impl::string_hash::initial_state;
					char const *s = key;
					while(*s) {
						state = cppcms::impl::string_hash::update_state(state,*s++);
					}
					return state;
				}